

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void serial_test(void **param_1)

{
  bool bVar1;
  size_t sVar2;
  void *__buf;
  void *__dest;
  size_t in_RCX;
  ulong __n;
  Roaring t;
  Roaring r1;
  Roaring t2;
  uint32_t values [5];
  
  values[0] = 5;
  values[1] = 2;
  values[2] = 3;
  values[3] = 4;
  values[4] = 1;
  roaring::Roaring::Roaring(&r1,5,values);
  sVar2 = roaring::Roaring::getSizeInBytes(&r1,true);
  __n = sVar2 & 0xffffffff;
  __buf = operator_new__(__n);
  roaring::Roaring::write(&r1,(int)__buf,(void *)0x1,in_RCX);
  roaring::Roaring::read((int)&t,__buf,1);
  bVar1 = roaring::Roaring::operator==(&r1,&t);
  _assert_true((ulong)bVar1,"r1 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3f);
  __dest = operator_new__(__n);
  memcpy(__dest,__buf,__n);
  roaring::Roaring::read((int)&t2,__dest,1);
  bVar1 = roaring::Roaring::operator==(&t2,&t);
  _assert_true((ulong)bVar1,"t2 == t",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x43);
  operator_delete__(__buf);
  operator_delete__(__dest);
  roaring::Roaring::~Roaring(&t2);
  roaring::Roaring::~Roaring(&t);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

DEFINE_TEST(serial_test) {
    uint32_t values[] = {5, 2, 3, 4, 1};
    Roaring r1(sizeof(values) / sizeof(uint32_t), values);
    uint32_t serializesize = r1.getSizeInBytes();
    char *serializedbytes = new char[serializesize];
    r1.write(serializedbytes);
    Roaring t = Roaring::read(serializedbytes);
    assert_true(r1 == t);
    char *copy = new char[serializesize];
    memcpy(copy, serializedbytes, serializesize);
    Roaring t2 = Roaring::read(copy);
    assert_true(t2 == t);
    delete[] serializedbytes;
    delete[] copy;
}